

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVdfg_stone INT_EVdfg_create_sink_stone(EVdfg dfg,char *sink_name)

{
  size_t sVar1;
  char *__dest;
  EVdfg_stone p_Var2;
  
  sVar1 = strlen(sink_name);
  __dest = (char *)INT_CMmalloc(sVar1 + 6);
  builtin_strncpy(__dest,"sink:",6);
  strcat(__dest,sink_name);
  p_Var2 = INT_EVdfg_create_stone(dfg,__dest);
  free(__dest);
  return p_Var2;
}

Assistant:

EVdfg_stone
INT_EVdfg_create_sink_stone(EVdfg dfg, char *sink_name)
{
    EVdfg_stone tmp;
    size_t len = strlen(sink_name) + strlen("sink:");
    char *act = malloc(len + 1);
    strcpy(&act[0], "sink:");
    strcat(&act[0], sink_name);
    tmp = INT_EVdfg_create_stone(dfg, &act[0]);
    free(act);
    return tmp;
}